

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

char * cutfname(int which)

{
  int which_local;
  
  if (cutfname::beenhere == '\0') {
    cutfname::beenhere = '\x01';
    Fl_Preferences::getUserdataPath(&fluid_prefs,cutfname::name[0],0x800);
    fl_strlcat(cutfname::name[0],"cut_buffer",0x800);
    Fl_Preferences::getUserdataPath(&fluid_prefs,cutfname::name[1],0x800);
    fl_strlcat(cutfname::name[1],"dup_buffer",0x800);
  }
  return cutfname::name[which];
}

Assistant:

static char* cutfname(int which = 0) {
  static char name[2][FL_PATH_MAX];
  static char beenhere = 0;

  if (!beenhere) {
    beenhere = 1;
    fluid_prefs.getUserdataPath(name[0], sizeof(name[0]));
    strlcat(name[0], "cut_buffer", sizeof(name[0]));
    fluid_prefs.getUserdataPath(name[1], sizeof(name[1]));
    strlcat(name[1], "dup_buffer", sizeof(name[1]));
  }

  return name[which];
}